

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_6_3_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  float *data;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  uint uVar41;
  ulong uVar42;
  int c1;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  ulong uVar49;
  int c2;
  long lVar50;
  int iVar51;
  long lVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  uint uVar58;
  float *pfVar59;
  int c1_7;
  float *pfVar60;
  long lVar61;
  long lVar62;
  int iVar63;
  ulong uVar64;
  int iVar65;
  int iVar66;
  float *pfVar67;
  int scale;
  long lVar68;
  int c2_4;
  long lVar69;
  long lVar70;
  long lVar71;
  float *pfVar72;
  ulong uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  undefined1 auVar114 [12];
  undefined1 auVar113 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  undefined1 auVar118 [64];
  int data_width;
  int local_178;
  float *local_d8;
  float *local_d0;
  
  auVar82._8_4_ = 0x3effffff;
  auVar82._0_8_ = 0x3effffff3effffff;
  auVar82._12_4_ = 0x3effffff;
  auVar113 = ZEXT1664(auVar82);
  auVar81._8_4_ = 0x80000000;
  auVar81._0_8_ = 0x8000000080000000;
  auVar81._12_4_ = 0x80000000;
  fVar89 = ipoint->scale;
  auVar118 = ZEXT464((uint)fVar89);
  auVar74 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)fVar89),auVar81,0xf8);
  auVar74 = ZEXT416((uint)(fVar89 + auVar74._0_4_));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  fVar87 = -0.08 / (fVar89 * fVar89);
  scale = (int)auVar74._0_4_;
  auVar75._0_4_ = (int)auVar74._0_4_;
  auVar75._4_4_ = (int)auVar74._4_4_;
  auVar75._8_4_ = (int)auVar74._8_4_;
  auVar75._12_4_ = (int)auVar74._12_4_;
  auVar74 = vcvtdq2ps_avx(auVar75);
  auVar75 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)ipoint->x),auVar81,0xf8);
  auVar75 = ZEXT416((uint)(ipoint->x + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76._0_8_ = (double)auVar75._0_4_;
  auVar76._8_8_ = auVar75._8_8_;
  auVar80._0_8_ = (double)fVar89;
  auVar80._8_8_ = 0;
  auVar75 = vfmadd231sd_fma(auVar76,auVar80,ZEXT816(0x3fe0000000000000));
  auVar79._0_4_ = (float)auVar75._0_8_;
  auVar79._4_12_ = auVar75._4_12_;
  auVar75 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)ipoint->y),auVar81,0xf8);
  fVar8 = auVar79._0_4_ - auVar74._0_4_;
  auVar75 = ZEXT416((uint)(ipoint->y + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar77._0_8_ = (double)auVar75._0_4_;
  auVar77._8_8_ = auVar75._8_8_;
  auVar75 = vfmadd231sd_fma(auVar77,auVar80,ZEXT816(0x3fe0000000000000));
  auVar78._0_4_ = (float)auVar75._0_8_;
  auVar78._4_12_ = auVar75._4_12_;
  fVar117 = auVar78._0_4_ - auVar74._0_4_;
  auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar89),auVar79);
  auVar75 = vpternlogd_avx512vl(auVar82,auVar74,auVar81,0xf8);
  auVar74 = ZEXT416((uint)(auVar74._0_4_ + auVar75._0_4_));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = ZEXT416((uint)fVar89);
  if (scale < (int)auVar74._0_4_) {
    auVar83._8_4_ = 0x3effffff;
    auVar83._0_8_ = 0x3effffff3effffff;
    auVar83._12_4_ = 0x3effffff;
    auVar84._8_4_ = 0x80000000;
    auVar84._0_8_ = 0x8000000080000000;
    auVar84._12_4_ = 0x80000000;
    auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar75,auVar78);
    auVar76 = vpternlogd_avx512vl(auVar84,auVar74,auVar83,0xea);
    auVar74 = ZEXT416((uint)(auVar74._0_4_ + auVar76._0_4_));
    auVar74 = vroundss_avx(auVar74,auVar74,0xb);
    if (scale < (int)auVar74._0_4_) {
      auVar74 = vfmadd231ss_fma(auVar79,auVar75,ZEXT416(0x41300000));
      auVar85._8_4_ = 0x80000000;
      auVar85._0_8_ = 0x8000000080000000;
      auVar85._12_4_ = 0x80000000;
      auVar76 = vpternlogd_avx512vl(auVar85,auVar74,auVar83,0xea);
      auVar74 = ZEXT416((uint)(auVar74._0_4_ + auVar76._0_4_));
      auVar74 = vroundss_avx(auVar74,auVar74,0xb);
      if ((int)auVar74._0_4_ + scale <= iimage->width) {
        auVar74 = vfmadd231ss_fma(auVar78,auVar75,ZEXT416(0x41300000));
        auVar17._8_4_ = 0x80000000;
        auVar17._0_8_ = 0x8000000080000000;
        auVar17._12_4_ = 0x80000000;
        auVar76 = vpternlogd_avx512vl(auVar83,auVar74,auVar17,0xf8);
        auVar74 = ZEXT416((uint)(auVar74._0_4_ + auVar76._0_4_));
        auVar74 = vroundss_avx(auVar74,auVar74,0xb);
        if ((int)auVar74._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar59 = iimage->data;
          iVar55 = scale * 2;
          fVar8 = fVar8 + 0.5;
          fVar117 = fVar117 + 0.5;
          local_d8 = haarResponseY + 0x7a;
          local_d0 = haarResponseX + 0x7a;
          uVar41 = 0xfffffff4;
          do {
            auVar74._0_4_ = (float)(int)uVar41;
            auVar114 = in_ZMM8._4_12_;
            auVar74._4_12_ = auVar114;
            auVar74 = vfmadd213ss_fma(auVar74,auVar75,ZEXT416((uint)fVar117));
            iVar24 = (int)auVar74._0_4_;
            auVar103._0_4_ = (float)(int)(uVar41 | 1);
            auVar103._4_12_ = auVar114;
            auVar74 = vfmadd213ss_fma(auVar103,auVar75,ZEXT416((uint)fVar117));
            iVar23 = (int)auVar74._0_4_;
            auVar104._0_4_ = (float)(int)(uVar41 + 2);
            auVar104._4_12_ = auVar114;
            auVar76 = ZEXT416((uint)fVar117);
            auVar74 = vfmadd213ss_fma(auVar104,auVar75,auVar76);
            iVar26 = (int)auVar74._0_4_;
            auVar105._0_4_ = (float)(int)(uVar41 + 3);
            auVar105._4_12_ = auVar114;
            auVar74 = vfmadd213ss_fma(auVar105,auVar75,auVar76);
            iVar27 = (int)auVar74._0_4_;
            auVar106._0_4_ = (float)(int)(uVar41 + 4);
            auVar106._4_12_ = auVar114;
            auVar74 = vfmadd213ss_fma(auVar106,auVar75,auVar76);
            iVar22 = (int)auVar74._0_4_;
            auVar107._0_4_ = (float)(int)(uVar41 + 5);
            auVar107._4_12_ = auVar114;
            auVar74 = vfmadd213ss_fma(auVar107,auVar75,auVar76);
            iVar35 = (iVar24 + -1 + scale) * iVar1;
            iVar29 = (iVar24 + -1 + iVar55) * iVar1;
            iVar39 = (iVar24 + -1) * iVar1;
            iVar24 = (iVar23 + -1) * iVar1;
            iVar36 = (iVar23 + -1 + scale) * iVar1;
            iVar30 = (iVar23 + -1 + iVar55) * iVar1;
            iVar25 = (iVar26 + -1 + scale) * iVar1;
            iVar31 = (iVar26 + -1) * iVar1;
            iVar37 = (iVar26 + -1 + iVar55) * iVar1;
            iVar33 = (iVar27 + -1) * iVar1;
            iVar28 = (int)auVar74._0_4_;
            iVar26 = (iVar27 + -1 + scale) * iVar1;
            iVar32 = (iVar27 + -1 + iVar55) * iVar1;
            iVar23 = (iVar22 + -1) * iVar1;
            iVar34 = (iVar22 + -1 + iVar55) * iVar1;
            iVar27 = (iVar22 + -1 + scale) * iVar1;
            iVar38 = (iVar28 + -1) * iVar1;
            iVar22 = (iVar28 + -1 + scale) * iVar1;
            iVar28 = (iVar28 + -1 + iVar55) * iVar1;
            lVar70 = 0;
            do {
              iVar40 = (int)lVar70;
              auVar108._0_4_ = (float)(iVar40 + -0xc);
              auVar114 = auVar113._4_12_;
              auVar108._4_12_ = auVar114;
              auVar74 = vfmadd213ss_fma(auVar108,auVar75,ZEXT416((uint)fVar8));
              iVar47 = (int)auVar74._0_4_;
              auVar109._0_4_ = (float)(iVar40 + -0xb);
              auVar109._4_12_ = auVar114;
              auVar74 = vfmadd213ss_fma(auVar109,auVar75,ZEXT416((uint)fVar8));
              iVar46 = (int)auVar74._0_4_;
              auVar110._0_4_ = (float)(iVar40 + -10);
              auVar110._4_12_ = auVar114;
              iVar43 = iVar47 + -1 + scale;
              auVar74 = vfmadd213ss_fma(auVar110,auVar75,ZEXT416((uint)fVar8));
              iVar44 = iVar47 + -1 + iVar55;
              fVar89 = pfVar59[iVar29 + -1 + iVar47];
              fVar88 = pfVar59[iVar39 + iVar44];
              auVar78 = SUB6416(ZEXT464(0x40000000),0);
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar39 + iVar43] -
                                                      pfVar59[iVar29 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar29 + iVar44] -
                                                      pfVar59[iVar39 + -1 + iVar47])));
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar35 + -1 + iVar47] -
                                                      pfVar59[iVar35 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar29 + iVar44] -
                                                      pfVar59[iVar39 + -1 + iVar47])));
              local_d0[lVar70 + -0x7a] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x7a] = auVar77._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar30 + -1 + iVar47];
              fVar88 = pfVar59[iVar24 + iVar44];
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar24 + iVar43] -
                                                      pfVar59[iVar30 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar30 + iVar44] -
                                                      pfVar59[iVar24 + -1 + iVar47])));
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar36 + -1 + iVar47] -
                                                      pfVar59[iVar36 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar30 + iVar44] -
                                                      pfVar59[iVar24 + -1 + iVar47])));
              local_d0[lVar70 + -0x62] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x62] = auVar77._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar37 + -1 + iVar47];
              fVar88 = pfVar59[iVar31 + iVar44];
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar31 + iVar43] -
                                                      pfVar59[iVar37 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar37 + iVar44] -
                                                      pfVar59[iVar31 + -1 + iVar47])));
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + -1 + iVar47] -
                                                      pfVar59[iVar25 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar37 + iVar44] -
                                                      pfVar59[iVar31 + -1 + iVar47])));
              local_d0[lVar70 + -0x4a] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x4a] = auVar77._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar32 + -1 + iVar47];
              fVar88 = pfVar59[iVar33 + iVar44];
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar33 + iVar43] -
                                                      pfVar59[iVar32 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar32 + iVar44] -
                                                      pfVar59[iVar33 + -1 + iVar47])));
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar26 + -1 + iVar47] -
                                                      pfVar59[iVar26 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar32 + iVar44] -
                                                      pfVar59[iVar33 + -1 + iVar47])));
              local_d0[lVar70 + -0x32] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x32] = auVar77._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar34 + -1 + iVar47];
              fVar88 = pfVar59[iVar23 + iVar44];
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar23 + iVar43] -
                                                      pfVar59[iVar34 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar34 + iVar44] -
                                                      pfVar59[iVar23 + -1 + iVar47])));
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar27 + -1 + iVar47] -
                                                      pfVar59[iVar27 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar34 + iVar44] -
                                                      pfVar59[iVar23 + -1 + iVar47])));
              local_d0[lVar70 + -0x1a] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x1a] = auVar77._0_4_ - (fVar89 - fVar88);
              auVar113 = ZEXT464((uint)pfVar59[iVar44 + iVar28]);
              iVar45 = (int)auVar74._0_4_;
              fVar89 = pfVar59[iVar28 + -1 + iVar47];
              fVar88 = pfVar59[iVar38 + iVar44];
              auVar76 = ZEXT416((uint)(pfVar59[iVar44 + iVar28] - pfVar59[iVar38 + -1 + iVar47]));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar38 + iVar43] -
                                                      pfVar59[iVar43 + iVar28])),auVar78,auVar76);
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar22 + -1 + iVar47] -
                                                      pfVar59[iVar22 + iVar44])),auVar78,auVar76);
              local_d0[lVar70 + -2] = (fVar89 - fVar88) + auVar74._0_4_;
              local_d8[lVar70 + -2] = auVar76._0_4_ - (fVar89 - fVar88);
              iVar43 = iVar46 + -1 + scale;
              iVar44 = iVar46 + -1 + iVar55;
              fVar89 = pfVar59[iVar29 + -1 + iVar46];
              fVar88 = pfVar59[iVar39 + iVar44];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar39 + iVar43] -
                                                      pfVar59[iVar29 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar29 + iVar44] -
                                                      pfVar59[iVar39 + -1 + iVar46])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar35 + -1 + iVar46] -
                                                      pfVar59[iVar35 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar29 + iVar44] -
                                                      pfVar59[iVar39 + -1 + iVar46])));
              local_d0[lVar70 + -0x79] = (fVar89 - fVar88) + auVar74._0_4_;
              local_d8[lVar70 + -0x79] = auVar76._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar30 + -1 + iVar46];
              fVar88 = pfVar59[iVar24 + iVar44];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar24 + iVar43] -
                                                      pfVar59[iVar30 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar30 + iVar44] -
                                                      pfVar59[iVar24 + -1 + iVar46])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar36 + -1 + iVar46] -
                                                      pfVar59[iVar36 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar30 + iVar44] -
                                                      pfVar59[iVar24 + -1 + iVar46])));
              local_d0[lVar70 + -0x61] = (fVar89 - fVar88) + auVar74._0_4_;
              local_d8[lVar70 + -0x61] = auVar76._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar37 + -1 + iVar46];
              fVar88 = pfVar59[iVar31 + iVar44];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar31 + iVar43] -
                                                      pfVar59[iVar37 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar37 + iVar44] -
                                                      pfVar59[iVar31 + -1 + iVar46])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + -1 + iVar46] -
                                                      pfVar59[iVar25 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar37 + iVar44] -
                                                      pfVar59[iVar31 + -1 + iVar46])));
              local_d0[lVar70 + -0x49] = (fVar89 - fVar88) + auVar74._0_4_;
              local_d8[lVar70 + -0x49] = auVar76._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar32 + -1 + iVar46];
              fVar88 = pfVar59[iVar33 + iVar44];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar33 + iVar43] -
                                                      pfVar59[iVar32 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar32 + iVar44] -
                                                      pfVar59[iVar33 + -1 + iVar46])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar26 + -1 + iVar46] -
                                                      pfVar59[iVar26 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar32 + iVar44] -
                                                      pfVar59[iVar33 + -1 + iVar46])));
              local_d0[lVar70 + -0x31] = (fVar89 - fVar88) + auVar74._0_4_;
              local_d8[lVar70 + -0x31] = auVar76._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar34 + -1 + iVar46];
              fVar88 = pfVar59[iVar23 + iVar44];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar23 + iVar43] -
                                                      pfVar59[iVar34 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar34 + iVar44] -
                                                      pfVar59[iVar23 + -1 + iVar46])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar27 + -1 + iVar46] -
                                                      pfVar59[iVar27 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar34 + iVar44] -
                                                      pfVar59[iVar23 + -1 + iVar46])));
              local_d0[lVar70 + -0x19] = (fVar89 - fVar88) + auVar74._0_4_;
              local_d8[lVar70 + -0x19] = auVar76._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar28 + -1 + iVar46];
              fVar88 = pfVar59[iVar38 + iVar44];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar38 + iVar43] -
                                                      pfVar59[iVar43 + iVar28])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar44 + iVar28] -
                                                      pfVar59[iVar38 + -1 + iVar46])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar22 + -1 + iVar46] -
                                                      pfVar59[iVar22 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar44 + iVar28] -
                                                      pfVar59[iVar38 + -1 + iVar46])));
              local_d0[lVar70 + -1] = (fVar89 - fVar88) + auVar74._0_4_;
              local_d8[lVar70 + -1] = auVar76._0_4_ - (fVar89 - fVar88);
              iVar44 = iVar45 + -1 + scale;
              iVar43 = iVar45 + -1 + iVar55;
              fVar89 = pfVar59[iVar29 + -1 + iVar45];
              fVar88 = pfVar59[iVar39 + iVar43];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar35 + -1 + iVar45] -
                                                      pfVar59[iVar35 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar29 + iVar43] -
                                                      pfVar59[iVar39 + -1 + iVar45])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar39 + iVar44] -
                                                      pfVar59[iVar29 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar29 + iVar43] -
                                                      pfVar59[iVar39 + -1 + iVar45])));
              local_d0[lVar70 + -0x78] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x78] = auVar74._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar30 + -1 + iVar45];
              fVar88 = pfVar59[iVar24 + iVar43];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar36 + -1 + iVar45] -
                                                      pfVar59[iVar36 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar30 + iVar43] -
                                                      pfVar59[iVar24 + -1 + iVar45])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar24 + iVar44] -
                                                      pfVar59[iVar30 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar30 + iVar43] -
                                                      pfVar59[iVar24 + -1 + iVar45])));
              local_d0[lVar70 + -0x60] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x60] = auVar74._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar37 + -1 + iVar45];
              fVar88 = pfVar59[iVar31 + iVar43];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + -1 + iVar45] -
                                                      pfVar59[iVar25 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar37 + iVar43] -
                                                      pfVar59[iVar31 + -1 + iVar45])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar31 + iVar44] -
                                                      pfVar59[iVar37 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar37 + iVar43] -
                                                      pfVar59[iVar31 + -1 + iVar45])));
              local_d0[lVar70 + -0x48] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x48] = auVar74._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar32 + -1 + iVar45];
              fVar88 = pfVar59[iVar33 + iVar43];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar26 + -1 + iVar45] -
                                                      pfVar59[iVar26 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar32 + iVar43] -
                                                      pfVar59[iVar33 + -1 + iVar45])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar33 + iVar44] -
                                                      pfVar59[iVar32 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar32 + iVar43] -
                                                      pfVar59[iVar33 + -1 + iVar45])));
              local_d0[lVar70 + -0x30] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x30] = auVar74._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar34 + -1 + iVar45];
              fVar88 = pfVar59[iVar23 + iVar43];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar27 + -1 + iVar45] -
                                                      pfVar59[iVar27 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar34 + iVar43] -
                                                      pfVar59[iVar23 + -1 + iVar45])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar23 + iVar44] -
                                                      pfVar59[iVar34 + iVar44])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar34 + iVar43] -
                                                      pfVar59[iVar23 + -1 + iVar45])));
              local_d0[lVar70 + -0x18] = (fVar89 - fVar88) + auVar76._0_4_;
              local_d8[lVar70 + -0x18] = auVar74._0_4_ - (fVar89 - fVar88);
              fVar89 = pfVar59[iVar28 + -1 + iVar45];
              fVar88 = pfVar59[iVar38 + iVar43];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar38 + iVar44] -
                                                      pfVar59[iVar44 + iVar28])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar43 + iVar28] -
                                                      pfVar59[iVar38 + -1 + iVar45])));
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar22 + -1 + iVar45] -
                                                      pfVar59[iVar22 + iVar43])),auVar78,
                                        ZEXT416((uint)(pfVar59[iVar43 + iVar28] -
                                                      pfVar59[iVar38 + -1 + iVar45])));
              local_d0[lVar70] = (fVar89 - fVar88) + auVar74._0_4_;
              local_d8[lVar70] = auVar76._0_4_ - (fVar89 - fVar88);
              lVar70 = lVar70 + 3;
            } while (iVar40 + -0xc < 9);
            local_d8 = local_d8 + 0x90;
            local_d0 = local_d0 + 0x90;
            bVar3 = (int)uVar41 < 6;
            uVar41 = uVar41 + 6;
          } while (bVar3);
          goto LAB_0025fe77;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar70 = 0;
  uVar41 = 0xfffffff4;
  do {
    auVar74 = vpbroadcastd_avx512vl();
    auVar74 = vpaddd_avx(auVar74,_DAT_00599790);
    auVar93._0_4_ = (float)(int)uVar41;
    auVar93._4_12_ = in_ZMM8._4_12_;
    auVar97._0_4_ = (float)(int)(uVar41 | 1);
    auVar97._4_12_ = in_ZMM8._4_12_;
    auVar76 = vfmadd213ss_fma(auVar93,auVar118._0_16_,ZEXT416((uint)fVar117));
    auVar77 = vfmadd213ss_fma(auVar97,auVar118._0_16_,ZEXT416((uint)fVar117));
    fVar88 = auVar76._0_4_;
    fVar95 = auVar77._0_4_;
    iVar29 = (int)((double)((ulong)(0.0 <= fVar88) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar88) * -0x4020000000000000) + (double)fVar88);
    auVar74 = vcvtdq2ps_avx(auVar74);
    iVar43 = iVar1 + iVar29;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar95) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar95) * -0x4020000000000000) + (double)fVar95);
    auVar20._4_4_ = fVar117;
    auVar20._0_4_ = fVar117;
    auVar20._8_4_ = fVar117;
    auVar20._12_4_ = fVar117;
    auVar21._4_4_ = fVar89;
    auVar21._0_4_ = fVar89;
    auVar21._8_4_ = fVar89;
    auVar21._12_4_ = fVar89;
    auVar74 = vfmadd132ps_fma(auVar74,auVar20,auVar21);
    uVar42 = vcmpps_avx512vl(auVar74,_DAT_00599190,0xd);
    auVar7 = vcvtps2pd_avx(auVar74);
    auVar92._8_8_ = 0xbfe0000000000000;
    auVar92._0_8_ = 0xbfe0000000000000;
    auVar92._16_8_ = 0xbfe0000000000000;
    auVar92._24_8_ = 0xbfe0000000000000;
    auVar86._12_4_ = 0x3fe00000;
    auVar86._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar86._16_8_ = 0x3fe0000000000000;
    auVar86._24_8_ = 0x3fe0000000000000;
    auVar86 = vblendmpd_avx512vl(auVar92,auVar86);
    bVar3 = (bool)((byte)uVar42 & 1);
    bVar4 = (bool)((byte)(uVar42 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar42 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar42 >> 3) & 1);
    iVar44 = iVar29 + -1;
    iVar45 = iVar29 + -1 + scale;
    iVar30 = iVar1 + -1 + iVar29;
    iVar31 = iVar1 + iVar22;
    iVar32 = iVar22 + -1 + scale;
    iVar33 = iVar1 + -1 + iVar22;
    iVar23 = iVar22 + -1;
    auVar90._0_4_ =
         (int)((double)((ulong)bVar3 * auVar86._0_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar7._0_8_);
    auVar90._4_4_ =
         (int)((double)((ulong)bVar4 * auVar86._8_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar7._8_8_);
    auVar90._8_4_ =
         (int)((double)((ulong)bVar5 * auVar86._16_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar7._16_8_);
    auVar90._12_4_ =
         (int)((double)((ulong)bVar6 * auVar86._24_8_ | (ulong)!bVar6 * -0x4020000000000000) +
              auVar7._24_8_);
    auVar18._8_4_ = 1;
    auVar18._0_8_ = 0x100000001;
    auVar18._12_4_ = 1;
    uVar42 = vpcmpd_avx512vl(auVar90,auVar18,1);
    uVar73 = uVar42 & 0xf;
    iVar24 = iVar1 + auVar90._12_4_;
    iVar53 = iVar1 + -1 + auVar90._12_4_;
    iVar25 = auVar90._12_4_ + -1 + scale;
    uVar64 = uVar73 >> 1;
    uVar49 = uVar73 >> 2;
    uVar73 = uVar73 >> 3;
    iVar46 = auVar90._12_4_ + -1;
    iVar34 = iVar1 + auVar90._8_4_;
    iVar35 = auVar90._8_4_ + -1 + scale;
    iVar36 = auVar90._8_4_ + -1;
    iVar26 = iVar1 + -1 + auVar90._8_4_;
    iVar37 = iVar1 + auVar90._4_4_;
    iVar38 = auVar90._4_4_ + -1;
    iVar39 = auVar90._4_4_ + -1 + scale;
    iVar27 = iVar1 + -1 + auVar90._4_4_;
    iVar54 = auVar90._0_4_ + -1 + scale;
    iVar40 = iVar1 + auVar90._0_4_;
    iVar47 = iVar1 + -1 + auVar90._0_4_;
    iVar28 = auVar90._0_4_ + -1;
    pfVar59 = haarResponseX;
    pfVar72 = haarResponseY;
    lVar69 = lVar70;
    iVar55 = -0xc;
    do {
      auVar91._0_4_ = (float)iVar55;
      auVar114 = auVar113._4_12_;
      auVar91._4_12_ = auVar114;
      auVar101._0_4_ = (float)(iVar55 + 1);
      auVar101._4_12_ = auVar114;
      auVar77 = auVar118._0_16_;
      auVar74 = vfmadd213ss_fma(auVar91,auVar77,ZEXT416((uint)fVar8));
      auVar76 = vfmadd213ss_fma(auVar101,auVar77,ZEXT416((uint)fVar8));
      auVar98._0_4_ = (float)(iVar55 + 2);
      auVar98._4_12_ = auVar114;
      fVar100 = auVar76._0_4_;
      auVar76 = vfmadd213ss_fma(auVar98,auVar77,ZEXT416((uint)fVar8));
      fVar88 = auVar74._0_4_;
      fVar95 = auVar76._0_4_;
      iVar51 = (int)((double)((ulong)(0.0 <= fVar88) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar88) * -0x4020000000000000) + (double)fVar88);
      if (((iVar29 < 1) || (iVar51 < 1)) || (iimage->height < iVar43)) {
LAB_0025e8bb:
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar29,iVar51,scale,(float *)((long)pfVar59 + lVar69),
               (float *)((long)pfVar72 + lVar69));
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar48 = iimage->width;
        iVar56 = iVar1 + iVar51;
        if (iVar48 < iVar56) goto LAB_0025e8bb;
        iVar57 = iimage->data_width;
        iVar66 = iVar51 + -1 + scale;
        pfVar67 = iimage->data;
        iVar65 = iVar57 * iVar44;
        iVar63 = iVar57 * iVar30;
        fVar88 = pfVar67[iVar63 + -1 + iVar51];
        fVar9 = pfVar67[iVar65 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar67[iVar65 + iVar66] - pfVar67[iVar63 + iVar66]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar67[iVar63 + -1 + iVar56] -
                                                pfVar67[iVar65 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar67[iVar57 * iVar45 + -1 + iVar51] -
                                                pfVar67[iVar57 * iVar45 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar67[iVar63 + -1 + iVar56] -
                                                pfVar67[iVar65 + -1 + iVar51])));
        *(float *)((long)pfVar59 + lVar69) = (fVar88 - fVar9) + auVar74._0_4_;
        *(float *)((long)pfVar72 + lVar69) = auVar76._0_4_ - (fVar88 - fVar9);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x60);
      pfVar60 = (float *)((long)pfVar72 + lVar69 + 0x60);
      if (((iVar22 < 1) || (iVar51 < 1)) ||
         ((iimage->height < iVar31 || (iVar56 = iVar1 + iVar51, iVar48 < iVar56)))) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar22,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar23;
        iVar63 = iVar57 * iVar33;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar9 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar32 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar32 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar9) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar9);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0xc0);
      pfVar60 = (float *)(lVar69 + 0xc0 + (long)pfVar72);
      if (((iVar51 < 1 || uVar73 != 0) || (iimage->height < iVar24)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._12_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar46;
        iVar63 = iVar57 * iVar53;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar9 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar25 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar25 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar9) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar9);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x120);
      pfVar60 = (float *)(lVar69 + 0x120 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._8_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar36;
        iVar63 = iVar57 * iVar26;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar9 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar35 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar35 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar9) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar9);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x180);
      pfVar60 = (float *)(lVar69 + 0x180 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar64 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._4_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar38;
        iVar63 = iVar57 * iVar27;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar9 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar39 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar39 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar9) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar9);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x1e0);
      pfVar60 = (float *)(lVar69 + 0x1e0 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._0_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar66 = iVar51 + -1 + scale;
        iVar63 = iVar57 * iVar28;
        iVar65 = iVar57 * iVar47;
        fVar88 = pfVar2[iVar65 + -1 + iVar51];
        fVar9 = pfVar2[iVar63 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + iVar66] - pfVar2[iVar65 + iVar66]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar65 + -1 + iVar56] -
                                                pfVar2[iVar63 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar54 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar54 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar65 + -1 + iVar56] -
                                                pfVar2[iVar63 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar9) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar9);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 4);
      pfVar60 = (float *)((long)pfVar72 + lVar69 + 4);
      iVar51 = (int)((double)((ulong)(0.0 <= fVar100) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar100) * -0x4020000000000000) + (double)fVar100);
      if ((((iVar29 < 1) || (iVar51 < 1)) || (iimage->height < iVar43)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar29,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar44;
        iVar63 = iVar57 * iVar30;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar100 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar45 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar45 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar100) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar100);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 100);
      pfVar60 = (float *)((long)pfVar72 + lVar69 + 100);
      if (((iVar22 < 1) || (iVar51 < 1)) ||
         ((iimage->height < iVar31 || (iVar56 = iVar1 + iVar51, iVar48 < iVar56)))) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar22,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar23;
        iVar63 = iVar57 * iVar33;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar100 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar32 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar32 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar100) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar100);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0xc4);
      pfVar60 = (float *)(lVar69 + 0xc4 + (long)pfVar72);
      if (((iVar51 < 1 || uVar73 != 0) || (iimage->height < iVar24)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._12_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar46;
        iVar63 = iVar57 * iVar53;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar100 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar25 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar25 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar100) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar100);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x124);
      pfVar60 = (float *)(lVar69 + 0x124 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._8_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar36;
        iVar63 = iVar57 * iVar26;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar100 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar35 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar35 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar100) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar100);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x184);
      pfVar60 = (float *)(lVar69 + 0x184 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar64 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._4_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar38;
        iVar63 = iVar57 * iVar27;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar100 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar39 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar39 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar100) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar100);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x1e4);
      pfVar60 = (float *)(lVar69 + 0x1e4 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._0_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar66 = iVar51 + -1 + scale;
        iVar63 = iVar57 * iVar28;
        iVar65 = iVar57 * iVar47;
        fVar88 = pfVar2[iVar65 + -1 + iVar51];
        fVar100 = pfVar2[iVar63 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + iVar66] - pfVar2[iVar65 + iVar66]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar65 + -1 + iVar56] -
                                                pfVar2[iVar63 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar54 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar54 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar65 + -1 + iVar56] -
                                                pfVar2[iVar63 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar100) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar100);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 8);
      pfVar60 = (float *)((long)pfVar72 + lVar69 + 8);
      iVar51 = (int)((double)((ulong)(0.0 <= fVar95) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar95) * -0x4020000000000000) + (double)fVar95);
      if ((((iVar29 < 1) || (iVar51 < 1)) || (iimage->height < iVar43)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar29,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar44;
        iVar63 = iVar57 * iVar30;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar95 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar45 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar45 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar95) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar95);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x68);
      pfVar60 = (float *)((long)pfVar72 + lVar69 + 0x68);
      if (((iVar22 < 1) || (iVar51 < 1)) ||
         ((iimage->height < iVar31 || (iVar56 = iVar1 + iVar51, iVar48 < iVar56)))) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar22,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar23;
        iVar63 = iVar57 * iVar33;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar95 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar32 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar32 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar95) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar95);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 200);
      pfVar60 = (float *)(lVar69 + 200 + (long)pfVar72);
      if (((iVar51 < 1 || uVar73 != 0) || (iimage->height < iVar24)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._12_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar46;
        iVar63 = iVar57 * iVar53;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar95 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar25 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar25 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar95) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar95);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x128);
      pfVar60 = (float *)(lVar69 + 0x128 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar49 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._8_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar36;
        iVar63 = iVar57 * iVar26;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar95 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar35 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar35 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar95) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar95);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x188);
      pfVar60 = (float *)(lVar69 + 0x188 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar64 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._4_4_,iVar51,scale,pfVar67,pfVar60);
        iVar48 = iimage->width;
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar65 = iVar51 + -1 + scale;
        iVar66 = iVar57 * iVar38;
        iVar63 = iVar57 * iVar27;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar95 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar65] - pfVar2[iVar63 + iVar65]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar39 + -1 + iVar51] -
                                                pfVar2[iVar57 * iVar39 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar95) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar95);
      }
      pfVar67 = (float *)((long)pfVar59 + lVar69 + 0x1e8);
      pfVar60 = (float *)(lVar69 + 0x1e8 + (long)pfVar72);
      if (((iVar51 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar56 = iVar1 + iVar51, iVar48 < iVar56)) {
        auVar113 = ZEXT1664(auVar113._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar90._0_4_,iVar51,scale,pfVar67,pfVar60);
        pfVar59 = haarResponseX;
        pfVar72 = haarResponseY;
      }
      else {
        iVar48 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar57 = iVar51 + -1 + scale;
        iVar66 = iVar48 * iVar28;
        iVar63 = iVar48 * iVar47;
        fVar88 = pfVar2[iVar63 + -1 + iVar51];
        fVar95 = pfVar2[iVar66 + -1 + iVar56];
        auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar66 + iVar57] - pfVar2[iVar63 + iVar57]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar48 * iVar54 + -1 + iVar51] -
                                                pfVar2[iVar48 * iVar54 + -1 + iVar56])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar56] -
                                                pfVar2[iVar66 + -1 + iVar51])));
        *pfVar67 = (fVar88 - fVar95) + auVar74._0_4_;
        *pfVar60 = auVar76._0_4_ - (fVar88 - fVar95);
      }
      auVar118 = ZEXT1664(auVar75);
      lVar69 = lVar69 + 0xc;
      bVar3 = iVar55 < 9;
      iVar55 = iVar55 + 3;
    } while (bVar3);
    lVar70 = lVar70 + 0x240;
    bVar3 = (int)uVar41 < 6;
    uVar41 = uVar41 + 6;
  } while (bVar3);
LAB_0025fe77:
  fVar117 = auVar118._0_4_;
  auVar116._8_4_ = 0x3effffff;
  auVar116._0_8_ = 0x3effffff3effffff;
  auVar116._12_4_ = 0x3effffff;
  auVar115._8_4_ = 0x80000000;
  auVar115._0_8_ = 0x8000000080000000;
  auVar115._12_4_ = 0x80000000;
  auVar74 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 0.5)),auVar115,0xf8);
  auVar74 = ZEXT416((uint)(fVar117 * 0.5 + auVar74._0_4_));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 1.5)),auVar115,0xf8);
  auVar75 = ZEXT416((uint)(fVar117 * 1.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 2.5)),auVar115,0xf8);
  auVar76 = ZEXT416((uint)(fVar117 * 2.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 3.5)),auVar115,0xf8);
  auVar77 = ZEXT416((uint)(fVar117 * 3.5 + auVar77._0_4_));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 4.5)),auVar115,0xf8);
  auVar78 = ZEXT416((uint)(fVar117 * 4.5 + auVar78._0_4_));
  auVar78 = vroundss_avx(auVar78,auVar78,0xb);
  auVar79 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 5.5)),auVar115,0xf8);
  auVar79 = ZEXT416((uint)(fVar117 * 5.5 + auVar79._0_4_));
  auVar79 = vroundss_avx(auVar79,auVar79,0xb);
  auVar80 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 6.5)),auVar115,0xf8);
  auVar80 = ZEXT416((uint)(fVar117 * 6.5 + auVar80._0_4_));
  auVar80 = vroundss_avx(auVar80,auVar80,0xb);
  auVar81 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 7.5)),auVar115,0xf8);
  auVar81 = ZEXT416((uint)(auVar81._0_4_ + fVar117 * 7.5));
  auVar81 = vroundss_avx(auVar81,auVar81,0xb);
  auVar82 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 8.5)),auVar115,0xf8);
  auVar82 = ZEXT416((uint)(fVar117 * 8.5 + auVar82._0_4_));
  auVar82 = vroundss_avx(auVar82,auVar82,0xb);
  auVar83 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 9.5)),auVar115,0xf8);
  auVar83 = ZEXT416((uint)(fVar117 * 9.5 + auVar83._0_4_));
  auVar83 = vroundss_avx(auVar83,auVar83,0xb);
  auVar84 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 10.5)),auVar115,0xf8);
  auVar84 = ZEXT416((uint)(fVar117 * 10.5 + auVar84._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  auVar85 = vpternlogd_avx512vl(auVar116,ZEXT416((uint)(fVar117 * 11.5)),auVar115,0xf8);
  fVar96 = auVar76._0_4_;
  fVar89 = fVar96 + auVar75._0_4_;
  fVar8 = fVar96 + auVar74._0_4_;
  auVar76 = ZEXT416((uint)(fVar117 * 11.5 + auVar85._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  fVar117 = fVar96 - auVar74._0_4_;
  fVar88 = fVar96 - auVar75._0_4_;
  fVar95 = fVar96 - auVar77._0_4_;
  fVar100 = fVar96 - auVar78._0_4_;
  fVar9 = fVar96 - auVar79._0_4_;
  fVar96 = fVar96 - auVar80._0_4_;
  fVar112 = auVar81._0_4_;
  fVar10 = fVar112 - auVar77._0_4_;
  fVar11 = fVar112 - auVar78._0_4_;
  fVar12 = fVar112 - auVar79._0_4_;
  fVar13 = fVar112 - auVar80._0_4_;
  fVar14 = fVar112 - auVar82._0_4_;
  fVar15 = fVar112 - auVar83._0_4_;
  fVar16 = fVar112 - auVar84._0_4_;
  fVar112 = fVar112 - auVar76._0_4_;
  gauss_s1_c0[0] = expf(fVar89 * fVar89 * fVar87);
  gauss_s1_c0[1] = expf(fVar8 * fVar8 * fVar87);
  gauss_s1_c0[2] = expf(fVar117 * fVar117 * fVar87);
  gauss_s1_c0[3] = expf(fVar88 * fVar88 * fVar87);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar95 * fVar95 * fVar87);
  gauss_s1_c0[6] = expf(fVar100 * fVar100 * fVar87);
  gauss_s1_c0[7] = expf(fVar9 * fVar9 * fVar87);
  gauss_s1_c0[8] = expf(fVar96 * fVar96 * fVar87);
  gauss_s1_c1[0] = expf(fVar10 * fVar10 * fVar87);
  gauss_s1_c1[1] = expf(fVar11 * fVar11 * fVar87);
  gauss_s1_c1[2] = expf(fVar12 * fVar12 * fVar87);
  gauss_s1_c1[3] = expf(fVar13 * fVar13 * fVar87);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar14 * fVar14 * fVar87);
  gauss_s1_c1[6] = expf(fVar15 * fVar15 * fVar87);
  gauss_s1_c1[7] = expf(fVar16 * fVar16 * fVar87);
  gauss_s1_c1[8] = expf(fVar112 * fVar112 * fVar87);
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  uVar42 = 0xfffffff8;
  fVar89 = 0.0;
  lVar70 = 0;
  lVar69 = 0;
  local_178 = 0;
  do {
    pfVar59 = gauss_s1_c1;
    uVar41 = (uint)uVar42;
    if (uVar41 != 7) {
      pfVar59 = gauss_s1_c0;
    }
    lVar68 = (long)local_178;
    lVar69 = (long)(int)lVar69;
    if (uVar41 == 0xfffffff8) {
      pfVar59 = gauss_s1_c1;
    }
    uVar64 = 0;
    local_178 = local_178 + 4;
    uVar58 = 0xfffffff8;
    lVar61 = (long)haarResponseX + lVar70;
    lVar50 = (long)haarResponseY + lVar70;
    do {
      pfVar72 = gauss_s1_c1;
      if (uVar58 != 7) {
        pfVar72 = gauss_s1_c0;
      }
      auVar113 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar58 == 0xfffffff8) {
        pfVar72 = gauss_s1_c1;
      }
      uVar73 = (ulong)(uVar58 >> 0x1c & 0xfffffff8);
      uVar49 = uVar64;
      lVar52 = lVar50;
      lVar71 = lVar61;
      do {
        lVar62 = 0;
        pfVar67 = (float *)((long)pfVar59 + (ulong)(uint)((int)(uVar42 >> 0x1f) << 5));
        do {
          fVar8 = pfVar72[uVar73] * *pfVar67;
          pfVar67 = pfVar67 + (ulong)(~uVar41 >> 0x1f) * 2 + -1;
          auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar52 + lVar62 * 4)),
                                  ZEXT416(*(uint *)(lVar71 + lVar62 * 4)),0x10);
          lVar62 = lVar62 + 1;
          auVar111._0_4_ = fVar8 * auVar74._0_4_;
          auVar111._4_4_ = fVar8 * auVar74._4_4_;
          auVar111._8_4_ = fVar8 * auVar74._8_4_;
          auVar111._12_4_ = fVar8 * auVar74._12_4_;
          auVar74 = vandps_avx(auVar111,auVar94);
          auVar74 = vmovlhps_avx(auVar111,auVar74);
          auVar99._0_4_ = auVar113._0_4_ + auVar74._0_4_;
          auVar99._4_4_ = auVar113._4_4_ + auVar74._4_4_;
          auVar99._8_4_ = auVar113._8_4_ + auVar74._8_4_;
          auVar99._12_4_ = auVar113._12_4_ + auVar74._12_4_;
          auVar113 = ZEXT1664(auVar99);
        } while (lVar62 != 9);
        uVar49 = uVar49 + 0x18;
        uVar73 = uVar73 + (ulong)(-1 < (int)uVar58) * 2 + -1;
        lVar71 = lVar71 + 0x60;
        lVar52 = lVar52 + 0x60;
      } while (uVar49 < uVar58 * 0x18 + 0x198);
      uVar58 = uVar58 + 5;
      uVar64 = uVar64 + 0x78;
      fVar8 = gauss_s2_arr[lVar68];
      auVar19._4_4_ = fVar8;
      auVar19._0_4_ = fVar8;
      auVar19._8_4_ = fVar8;
      auVar19._12_4_ = fVar8;
      auVar77 = vmulps_avx512vl(auVar99,auVar19);
      lVar68 = lVar68 + 1;
      auVar102._0_4_ = auVar77._0_4_ * auVar77._0_4_;
      auVar102._4_4_ = auVar77._4_4_ * auVar77._4_4_;
      auVar102._8_4_ = auVar77._8_4_ * auVar77._8_4_;
      auVar102._12_4_ = auVar77._12_4_ * auVar77._12_4_;
      auVar75 = vshufpd_avx(auVar77,auVar77,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar69) = auVar77;
      lVar69 = lVar69 + 4;
      lVar61 = lVar61 + 0x1e0;
      lVar50 = lVar50 + 0x1e0;
      auVar74 = vmovshdup_avx(auVar102);
      auVar76 = vfmadd231ss_fma(auVar74,auVar77,auVar77);
      auVar74 = vshufps_avx(auVar77,auVar77,0xff);
      auVar75 = vfmadd213ss_fma(auVar75,auVar75,auVar76);
      auVar74 = vfmadd213ss_fma(auVar74,auVar74,auVar75);
      fVar89 = fVar89 + auVar74._0_4_;
    } while (local_178 != (int)lVar68);
    lVar70 = lVar70 + 0x14;
    uVar42 = (ulong)(uVar41 + 5);
  } while ((int)uVar41 < 3);
  if (fVar89 < 0.0) {
    fVar89 = sqrtf(fVar89);
  }
  else {
    auVar74 = vsqrtss_avx(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89));
    fVar89 = auVar74._0_4_;
  }
  lVar70 = 0;
  auVar113 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar89)));
  do {
    auVar118 = vmulps_avx512f(auVar113,*(undefined1 (*) [64])(ipoint->descriptor + lVar70));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar70) = auVar118;
    lVar70 = lVar70 + 0x10;
  } while (lVar70 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_6_3_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            float ipoint_y_sub_int_scale_add_l4_mul_scale = ipoint_y_sub_int_scale + l4 * scale;
            float ipoint_y_sub_int_scale_add_l5_mul_scale = ipoint_y_sub_int_scale + l5 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_l4_mul_scale + (ipoint_y_sub_int_scale_add_l4_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_l5_mul_scale + (ipoint_y_sub_int_scale_add_l5_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_05 + l4 * scale);
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_05 + l5 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}